

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O3

LONGLONG quick_select_longlong(LONGLONG *arr,int n)

{
  long lVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  LONGLONG t_2;
  long lVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  LONGLONG t_3;
  long lVar12;
  LONGLONG t_1;
  
  uVar4 = n - 1;
  iVar3 = (n - ((int)uVar4 >> 0x1f)) + -1 >> 1;
  if (1 < n) {
    iVar5 = 0;
    do {
      uVar11 = iVar5 + 1;
      uVar8 = (ulong)uVar11;
      if (uVar4 == uVar11) {
        lVar6 = arr[iVar5];
        if (arr[(int)uVar4] < lVar6) {
          arr[iVar5] = arr[(int)uVar4];
          arr[(int)uVar4] = lVar6;
        }
        break;
      }
      iVar9 = (int)(iVar5 + uVar4) / 2;
      lVar6 = arr[iVar9];
      lVar12 = arr[(int)uVar4];
      if (lVar12 < lVar6) {
        arr[iVar9] = lVar12;
        arr[(int)uVar4] = lVar6;
        lVar12 = lVar6;
      }
      lVar6 = arr[iVar5];
      if (lVar12 < lVar6) {
        arr[iVar5] = lVar12;
        arr[(int)uVar4] = lVar6;
        lVar6 = arr[iVar5];
      }
      lVar12 = arr[iVar9];
      if (lVar6 < lVar12) {
        arr[iVar9] = lVar6;
        arr[iVar5] = lVar12;
        lVar12 = arr[iVar9];
      }
      arr[iVar9] = arr[(int)uVar11];
      arr[(int)uVar11] = lVar12;
      uVar11 = uVar4;
      while( true ) {
        lVar6 = arr[iVar5];
        uVar8 = (ulong)(int)uVar8;
        do {
          lVar12 = arr[uVar8 + 1];
          uVar8 = uVar8 + 1;
        } while (lVar12 < lVar6);
        lVar2 = (long)(int)uVar11 + 1;
        do {
          uVar10 = uVar11;
          lVar7 = lVar2;
          lVar1 = arr[lVar7 + -2];
          uVar11 = uVar10 - 1;
          lVar2 = lVar7 + -1;
        } while (lVar6 < lVar1);
        if (lVar7 + -1 <= (long)uVar8) break;
        arr[uVar8] = lVar1;
        arr[lVar7 + -2] = lVar12;
      }
      arr[iVar5] = lVar1;
      arr[lVar7 + -2] = lVar6;
      if ((int)uVar11 <= iVar3) {
        iVar5 = (int)uVar8;
      }
      if (iVar3 < (int)uVar10) {
        uVar4 = uVar10 - 2;
      }
    } while (iVar5 < (int)uVar4);
  }
  return arr[iVar3];
}

Assistant:

static LONGLONG quick_select_longlong(LONGLONG arr[], int n) 
{
    int low, high ;
    int median;
    int middle, ll, hh;

    low = 0 ; high = n-1 ; median = (low + high) / 2;
    for (;;) {
        if (high <= low) /* One element only */
            return arr[median] ;

        if (high == low + 1) {  /* Two elements only */
            if (arr[low] > arr[high])
                ELEM_SWAP(arr[low], arr[high]) ;
            return arr[median] ;
        }

    /* Find median of low, middle and high items; swap into position low */
    middle = (low + high) / 2;
    if (arr[middle] > arr[high])    ELEM_SWAP(arr[middle], arr[high]) ;
    if (arr[low] > arr[high])       ELEM_SWAP(arr[low], arr[high]) ;
    if (arr[middle] > arr[low])     ELEM_SWAP(arr[middle], arr[low]) ;

    /* Swap low item (now in position middle) into position (low+1) */
    ELEM_SWAP(arr[middle], arr[low+1]) ;

    /* Nibble from each end towards middle, swapping items when stuck */
    ll = low + 1;
    hh = high;
    for (;;) {
        do ll++; while (arr[low] > arr[ll]) ;
        do hh--; while (arr[hh]  > arr[low]) ;

        if (hh < ll)
        break;

        ELEM_SWAP(arr[ll], arr[hh]) ;
    }

    /* Swap middle item (in position low) back into correct position */
    ELEM_SWAP(arr[low], arr[hh]) ;

    /* Re-set active partition */
    if (hh <= median)
        low = ll;
        if (hh >= median)
        high = hh - 1;
    }
}